

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::recordCommandBufferCommand
          (CLIntercept *this,cl_command_buffer_khr cmdbuf,char *functionName,string *tag,
          cl_uint num_sync_points_in_wait_list,cl_sync_point_khr *sync_point_wait_list,
          cl_sync_point_khr *sync_point)

{
  mapped_type *this_00;
  allocator local_61;
  cl_sync_point_khr *local_60;
  string local_58;
  cl_command_buffer_khr local_38;
  
  local_60 = sync_point_wait_list;
  local_38 = cmdbuf;
  std::mutex::lock(&this->m_Mutex);
  this_00 = std::
            map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
            ::operator[](&this->m_CommandBufferRecordMap,&local_38);
  std::__cxx11::string::string((string *)&local_58,(tag->_M_dataplus)._M_p,&local_61);
  SCommandBufferRecord::recordCommand
            (this_00,(cl_command_queue)0x0,functionName,&local_58,num_sync_points_in_wait_list,
             local_60,sync_point);
  std::__cxx11::string::~string((string *)&local_58);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::recordCommandBufferCommand(
    cl_command_buffer_khr cmdbuf,
    const char* functionName,
    const std::string& tag,
    cl_uint num_sync_points_in_wait_list,
    const cl_sync_point_khr* sync_point_wait_list,
    cl_sync_point_khr* sync_point )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    SCommandBufferRecord& recording = m_CommandBufferRecordMap[ cmdbuf ];
    recording.recordCommand(
        nullptr,
        functionName,
        tag.c_str(),
        num_sync_points_in_wait_list,
        sync_point_wait_list,
        sync_point );
}